

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_math.h
# Opt level: O0

uint lzham::math::floor_log2i(uint v)

{
  uint l;
  uint v_local;
  
  l = 0;
  for (v_local = v; 1 < v_local; v_local = v_local >> 1) {
    l = l + 1;
  }
  return l;
}

Assistant:

inline uint floor_log2i(uint v)
      {
         uint l = 0;
         while (v > 1U)
         {
            v >>= 1;
            l++;
         }
         return l;
      }